

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_tree_renderer.cpp
# Opt level: O2

void __thiscall
duckdb::TextTreeRenderer::SplitUpExtraInfo
          (TextTreeRenderer *this,
          InsertionOrderPreservingMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *extra_info,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
          *result,idx_t max_lines)

{
  pointer ppVar1;
  idx_t iVar2;
  size_type sVar3;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *ppVar4;
  InsertionOrderPreservingMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *pIVar5;
  size_type sVar6;
  bool bVar7;
  bool bVar8;
  const_iterator cVar9;
  reference pvVar10;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *item;
  pointer ppVar11;
  string *psVar12;
  TextTreeRenderer *this_00;
  ulong uVar13;
  idx_t i;
  size_type __n;
  ulong __n_00;
  _Alloc_hider source;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  splits;
  InsertionOrderPreservingMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *__range1;
  string str;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  truncated_splits;
  allocator local_149;
  pointer local_148;
  vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *local_140;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_138;
  InsertionOrderPreservingMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_118;
  string local_110;
  ulong local_f0;
  idx_t local_e8;
  ulong local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined8 local_a8;
  pointer local_98;
  string local_90;
  string local_70;
  string local_50;
  
  if ((extra_info->map_idx)._M_h._M_element_count != 0) {
    ppVar11 = (extra_info->map).
              super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              .
              super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    ppVar1 = (extra_info->map).
             super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             .
             super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    local_140 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)result;
    local_118 = extra_info;
    local_e8 = max_lines;
    do {
      if (ppVar11 == ppVar1) {
        ExtraInfoSeparator_abi_cxx11_(&local_110,this);
        ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>(local_140,&local_110);
        ::std::__cxx11::string::~string((string *)&local_110);
        local_148 = (local_118->map).
                    super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    .
                    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
        local_98 = (local_118->map).
                   super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   .
                   super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        local_e0 = local_e8 >> 1;
        local_f0 = 0;
        bVar7 = false;
        goto LAB_01673abb;
      }
      bVar7 = Utf8Proc::IsValid((ppVar11->second)._M_dataplus._M_p,
                                (ppVar11->second)._M_string_length);
      ppVar11 = ppVar11 + 1;
    } while (bVar7);
  }
  return;
LAB_01673abb:
  if (local_148 == local_98) {
    return;
  }
  this_00 = (TextTreeRenderer *)&local_148->second;
  ::std::__cxx11::string::string((string *)&local_50,(string *)this_00);
  RemovePadding(&local_110,this_00,&local_50);
  ::std::__cxx11::string::~string((string *)&local_50);
  if (local_110._M_string_length != 0) {
    ::std::__cxx11::string::string((string *)&local_90,(string *)local_148);
    ::std::__cxx11::string::string((string *)&local_70,"__",(allocator *)&local_d8);
    bVar8 = StringUtil::StartsWith(&local_90,&local_70);
    ::std::__cxx11::string::~string((string *)&local_70);
    ::std::__cxx11::string::~string((string *)&local_90);
    sVar6 = local_110._M_string_length;
    if (bVar8) {
LAB_01673bfc:
      uVar13 = 0;
      bVar8 = false;
      if (bVar7) {
LAB_01673c6d:
        ::std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::emplace_back<>((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)local_140);
        bVar8 = true;
      }
    }
    else {
      iVar2 = (this->config).node_render_width;
      sVar3 = (local_148->first)._M_string_length;
      ::std::__cxx11::string::string
                ((string *)&local_d8,anon_var_dwarf_3b2a754 + 8,(allocator *)&local_138);
      bVar8 = StringUtil::Contains((string *)&local_110,(string *)&local_d8);
      ::std::__cxx11::string::~string((string *)&local_d8);
      if (bVar8 || iVar2 - 7 <= sVar3 + sVar6 + 2) {
        ::std::operator+(&local_138,&local_148->first,":\n");
        ::std::operator+(&local_d8,&local_138,&local_110);
        ::std::__cxx11::string::operator=((string *)&local_110,(string *)&local_d8);
        ::std::__cxx11::string::~string((string *)&local_d8);
        ::std::__cxx11::string::~string((string *)&local_138);
        goto LAB_01673bfc;
      }
      ::std::operator+(&local_138,&local_148->first,": ");
      ::std::operator+(&local_d8,&local_138,&local_110);
      ::std::__cxx11::string::operator=((string *)&local_110,(string *)&local_d8);
      ::std::__cxx11::string::~string((string *)&local_d8);
      ::std::__cxx11::string::~string((string *)&local_138);
      uVar13 = CONCAT71((int7)((ulong)&local_138 >> 8),1);
      if ((~(byte)local_f0 & bVar7) != 0) goto LAB_01673c6d;
      bVar8 = false;
    }
    bVar7 = bVar8;
    ppVar11 = local_148;
    bVar8 = ::std::operator==(&local_148->first,"__cardinality__");
    if (bVar8) {
      ::std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::emplace_back<>((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)local_140);
      ::std::__cxx11::string::string((string *)&local_d8,"__timing__",(allocator *)&local_138);
      pIVar5 = local_118;
      cVar9 = InsertionOrderPreservingMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::find(local_118,&local_d8);
      ppVar4 = (pIVar5->map).
               super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               .
               super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      ::std::__cxx11::string::~string((string *)&local_d8);
      if (cVar9._M_current == ppVar4) goto LAB_01673ef2;
LAB_01673ee8:
      ::std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::emplace_back<>((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)local_140);
LAB_01673ef2:
      ::std::__cxx11::string::~string((string *)&local_110);
      return;
    }
    bVar8 = ::std::operator==(&ppVar11->first,"__estimated_cardinality__");
    if (bVar8) {
      ::std::__cxx11::string::string((string *)&local_d8,"__cardinality__",(allocator *)&local_138);
      pIVar5 = local_118;
      cVar9 = InsertionOrderPreservingMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::find(local_118,&local_d8);
      ppVar4 = (pIVar5->map).
               super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               .
               super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      ::std::__cxx11::string::~string((string *)&local_d8);
      if (cVar9._M_current == ppVar4) goto LAB_01673ee8;
      ::std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::pop_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_140);
    }
    else {
      ::std::__cxx11::string::string
                ((string *)&local_d8,anon_var_dwarf_3b2a754 + 8,(allocator *)&local_b8);
      StringUtil::Split((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                         *)&local_138,(string *)&local_110,(string *)&local_d8);
      ::std::__cxx11::string::~string((string *)&local_d8);
      psVar12 = (string *)local_138._M_string_length;
      source._M_p = local_138._M_dataplus._M_p;
      if (local_e8 <
          (ulong)((long)(local_138._M_string_length - (long)local_138._M_dataplus._M_p) >> 5)) {
        local_b8 = 0;
        uStack_b0 = 0;
        local_a8 = 0;
        for (__n = 0; local_e0 != __n; __n = __n + 1) {
          pvVar10 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                    ::get<true>((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                                 *)&local_138,__n);
          ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_b8,
                     pvVar10);
        }
        ::std::__cxx11::string::string((string *)&local_d8,"...",&local_149);
        ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_b8,
                   &local_d8);
        ::std::__cxx11::string::~string((string *)&local_d8);
        for (__n_00 = ((long)(local_138._M_string_length - (long)local_138._M_dataplus._M_p) >> 5) -
                      local_e0;
            __n_00 < (ulong)((long)(local_138._M_string_length - (long)local_138._M_dataplus._M_p)
                            >> 5); __n_00 = __n_00 + 1) {
          pvVar10 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                    ::get<true>((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                                 *)&local_138,__n_00);
          ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_b8,
                     pvVar10);
        }
        ::std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::_M_move_assign((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)&local_138,
                         (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)&local_b8);
        ::std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&local_b8);
        psVar12 = (string *)local_138._M_string_length;
        source._M_p = local_138._M_dataplus._M_p;
      }
      for (; (string *)source._M_p != psVar12; source._M_p = source._M_p + 0x20) {
        SplitStringBuffer(this,(string *)source._M_p,
                          (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                           *)local_140);
      }
      ::std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_138);
      bVar7 = true;
      local_f0 = uVar13 & 0xffffffff;
    }
  }
  ::std::__cxx11::string::~string((string *)&local_110);
  local_148 = local_148 + 1;
  goto LAB_01673abb;
}

Assistant:

void TextTreeRenderer::SplitUpExtraInfo(const InsertionOrderPreservingMap<string> &extra_info, vector<string> &result,
                                        idx_t max_lines) {
	if (extra_info.empty()) {
		return;
	}
	for (auto &item : extra_info) {
		auto &text = item.second;
		if (!Utf8Proc::IsValid(text.c_str(), text.size())) {
			return;
		}
	}
	result.push_back(ExtraInfoSeparator());

	bool requires_padding = false;
	bool was_inlined = false;
	for (auto &item : extra_info) {
		string str = RemovePadding(item.second);
		if (str.empty()) {
			continue;
		}
		bool is_inlined = false;
		if (!StringUtil::StartsWith(item.first, "__")) {
			// the name is not internal (i.e. not __text__) - so we display the name in addition to the entry
			const idx_t available_width = (config.node_render_width - 7);
			idx_t total_size = item.first.size() + str.size() + 2;
			bool is_multiline = StringUtil::Contains(str, "\n");
			if (!is_multiline && total_size < available_width) {
				// we can inline the full entry - no need for any separators unless the previous entry explicitly
				// requires it
				str = item.first + ": " + str;
				is_inlined = true;
			} else {
				str = item.first + ":\n" + str;
			}
		}
		if (is_inlined && was_inlined) {
			// we can skip the padding if we have multiple inlined entries in a row
			requires_padding = false;
		}
		if (requires_padding) {
			result.emplace_back();
		}
		// cardinality, timing and estimated cardinality are rendered separately
		// this is to allow alignment horizontally across nodes
		if (item.first == RenderTreeNode::CARDINALITY) {
			// cardinality - need to reserve space for cardinality AND timing
			result.emplace_back();
			if (extra_info.find(RenderTreeNode::TIMING) != extra_info.end()) {
				result.emplace_back();
			}
			break;
		}
		if (item.first == RenderTreeNode::ESTIMATED_CARDINALITY) {
			// estimated cardinality - reserve space for estimate
			if (extra_info.find(RenderTreeNode::CARDINALITY) != extra_info.end()) {
				// if we have a true cardinality render that instead of the estimate
				result.pop_back();
				continue;
			}
			result.emplace_back();
			break;
		}
		auto splits = StringUtil::Split(str, "\n");
		if (splits.size() > max_lines) {
			// truncate this entry
			vector<string> truncated_splits;
			for (idx_t i = 0; i < max_lines / 2; i++) {
				truncated_splits.push_back(std::move(splits[i]));
			}
			truncated_splits.push_back("...");
			for (idx_t i = splits.size() - max_lines / 2; i < splits.size(); i++) {
				truncated_splits.push_back(std::move(splits[i]));
			}
			splits = std::move(truncated_splits);
		}
		for (auto &split : splits) {
			SplitStringBuffer(split, result);
		}
		requires_padding = true;
		was_inlined = is_inlined;
	}
}